

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

void obx::anon_unknown_3::cCallbackTrampolineAsyncTreePut(obx_err status,obx_id id,void *userData)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  pointer *__ptr;
  string errorMessage;
  AsyncTreePutResult result;
  _Any_data *local_78;
  string local_70;
  AsyncTreePutResult local_50;
  
  if (userData == (void *)0x0) {
    __assert_fail("userData",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/build_O3/_deps/objectbox-download-src/include/objectbox.hpp"
                  ,0xd62,
                  "void obx::(anonymous namespace)::cCallbackTrampolineAsyncTreePut(obx_err, obx_id, void *)"
                 );
  }
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_allocated_capacity._0_4_ =
       local_70.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_78 = (_Any_data *)userData;
  if (status == 0) {
    local_50.result = Success;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    internal::appendLastErrorText(status,&local_70);
    local_50.result = DidNotPut;
    if (status != 0x3e9) {
      local_50.result = (uint)(status == 0x194) * 2;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      local_50.errorMessage._M_dataplus._M_p = local_70._M_dataplus._M_p;
      local_50.errorMessage.field_2._M_allocated_capacity =
           CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                    local_70.field_2._M_allocated_capacity._0_4_);
      goto LAB_00106b75;
    }
  }
  local_50.errorMessage._M_dataplus._M_p = (pointer)&local_50.errorMessage.field_2;
  local_50.errorMessage.field_2._M_allocated_capacity._4_4_ =
       local_70.field_2._M_allocated_capacity._4_4_;
  local_50.errorMessage.field_2._M_allocated_capacity._0_4_ =
       local_70.field_2._M_allocated_capacity._0_4_;
  local_50.errorMessage.field_2._8_4_ = local_70.field_2._8_4_;
  local_50.errorMessage.field_2._12_4_ = local_70.field_2._12_4_;
LAB_00106b75:
  local_50.errorMessage._M_string_length = local_70._M_string_length;
  local_70._M_string_length = 0;
  local_70.field_2._M_allocated_capacity._0_4_ =
       local_70.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_50.status = status;
  local_50.id = id;
  if (*(long *)(local_78 + 1) != 0) {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    (**(code **)(local_78->_M_pod_data + 0x18))(local_78,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.errorMessage._M_dataplus._M_p != &local_50.errorMessage.field_2) {
      operator_delete(local_50.errorMessage._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_78 != (_Any_data *)0x0) {
      std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>::operator()
                ((default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_> *)&local_78
                 ,(function<void_(const_obx::AsyncTreePutResult_&)> *)local_78);
    }
    return;
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  uVar2 = std::__throw_bad_function_call();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_78 != (_Any_data *)0x0) {
    std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>::operator()
              ((default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_> *)&local_78,
               (function<void_(const_obx::AsyncTreePutResult_&)> *)local_78);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

void cCallbackTrampolineAsyncTreePut(obx_err status, obx_id id, void* userData) {
    assert(userData);
    std::unique_ptr<AsyncTreePutCallback> callback(static_cast<AsyncTreePutCallback*>(userData));
    std::string errorMessage;
    if (status != OBX_SUCCESS) internal::appendLastErrorText(status, errorMessage);
    AsyncTreePutResult result{internal::mapErrorToTreePutResult(status), status, id, std::move(errorMessage)};
    (*callback)(result);
}